

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O2

CCountryFlag * __thiscall CCountryFlags::GetByIndex(CCountryFlags *this,int Index,bool SkipBlocked)

{
  uint uVar1;
  CCountryFlag *pCVar2;
  CCountryFlag *pCVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = (this->m_aCountryFlags).
          super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>.
          num_elements;
  pCVar2 = (this->m_aCountryFlags).
           super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
           .list;
  if ((int)CONCAT71(in_register_00000011,SkipBlocked) != 0) {
    uVar4 = 0;
    pCVar3 = pCVar2;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      if ((pCVar3->m_Blocked == false) && (bVar5 = Index == 0, Index = Index + -1, bVar5)) {
        return pCVar3;
      }
      pCVar3 = pCVar3 + 1;
    }
  }
  uVar4 = 0;
  if (0 < Index % (int)uVar1) {
    uVar4 = (ulong)(uint)(Index % (int)uVar1);
  }
  return pCVar2 + uVar4;
}

Assistant:

const CCountryFlags::CCountryFlag *CCountryFlags::GetByIndex(int Index, bool SkipBlocked) const
{
	if(SkipBlocked)
	{
		for(int i = 0; i < m_aCountryFlags.size(); i++)
			if(!m_aCountryFlags[i].m_Blocked)
				if(!Index--)
					return &m_aCountryFlags[i];
	}
	return &m_aCountryFlags[maximum(0, Index%m_aCountryFlags.size())];
}